

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O0

void __thiscall
FatSystem::FatSystem
          (FatSystem *this,string *filename_,unsigned_long_long globalOffset_,
          OutputFormatType outputFormat_)

{
  int iVar1;
  char *__file;
  ostream *poVar2;
  undefined8 uVar3;
  ostringstream local_1b0 [8];
  ostringstream oss;
  OutputFormatType outputFormat__local;
  unsigned_long_long globalOffset__local;
  string *filename__local;
  FatSystem *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)filename_);
  this->globalOffset = globalOffset_;
  this->type = 0;
  std::__cxx11::string::string((string *)&this->diskLabel);
  std::__cxx11::string::string((string *)&this->oemName);
  std::__cxx11::string::string((string *)&this->fsType);
  this->strange = 0;
  this->rootEntries = 0;
  this->totalSize = 0xffffffffffffffff;
  this->cacheEnabled = false;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map(&this->cache)
  ;
  this->statsComputed = false;
  this->freeClusters = 0;
  this->listDeleted = false;
  this->_outputFormat = outputFormat_;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = open(__file,0);
  this->fd = iVar1;
  this->writeMode = false;
  if (this->fd < 0) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar2 = std::operator<<((ostream *)local_1b0,"! Unable to open the input file: ");
    poVar2 = std::operator<<(poVar2,(string *)this);
    std::operator<<(poVar2," for reading");
    uVar3 = __cxa_allocate_exception(0x20);
    std::__cxx11::ostringstream::str();
    __cxa_throw(uVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  return;
}

Assistant:

FatSystem::FatSystem(string filename_, unsigned long long globalOffset_, OutputFormatType outputFormat_)
    : strange(0),
      filename(filename_),
      globalOffset(globalOffset_),
      totalSize(-1),
      listDeleted(false),
      statsComputed(false),
      freeClusters(0),
      cacheEnabled(false),
      type(FAT32),
    rootEntries(0)
{
    this->_outputFormat = outputFormat_;
    fd = open(filename.c_str(), O_RDONLY|O_LARGEFILE);
    writeMode = false;

    if (fd < 0) {
        ostringstream oss;
        oss << "! Unable to open the input file: " << filename << " for reading";

        throw oss.str();
    }
}